

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O2

int __thiscall Confparse::Load(Confparse *this,path *filepath,bool save_default)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  ostream *poVar5;
  ifstream file;
  size_t local_420;
  ofstream file_1;
  
  std::ifstream::ifstream(&file);
  std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
            (&file,filepath,_S_in|_S_bin|_S_ate);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    this->buffer_size = 0;
    this->conf = (char *)0x0;
    if (this->nested == false) {
      if (save_default) {
        iVar2 = SaveDefault(this,filepath);
      }
      else {
        std::ofstream::ofstream(&file_1);
        std::basic_ofstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                  (&file_1,filepath,_S_out|_S_bin|_S_ate);
        this->nested = true;
        std::ofstream::close();
        iVar2 = Load(this,filepath,false);
        std::ofstream::~ofstream(&file_1);
      }
      goto LAB_0010b7af;
    }
  }
  else {
    std::filesystem::__cxx11::path::operator=(&this->filepath,filepath);
    free(this->conf);
    sVar3 = std::istream::tellg();
    this->buffer_size = sVar3;
    pcVar4 = (char *)calloc(1,sVar3 + 1);
    this->conf = pcVar4;
    std::istream::seekg((long)&file,_S_beg);
    std::istream::read((char *)&file,(long)this->conf);
    this->limit = this->conf + sVar3;
    std::ifstream::close();
    if (local_420 == sVar3) {
      this->nested = false;
      iVar2 = 0;
      goto LAB_0010b7af;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "Did not read the right number of bytes from configuration file ");
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    poVar5 = std::operator<<(poVar5," != ");
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  iVar2 = 1;
LAB_0010b7af:
  std::ifstream::~ifstream(&file);
  return iVar2;
}

Assistant:

int Confparse::Load(const filesystem::path &filepath, bool save_default) {
	ifstream file;
	file.open(filepath, std::ios::in | std::ios::binary | std::ios::ate);
	if (!file.is_open()) {
		//		std::cerr << "Error opening " << filepath.string() << ": " <<
		// strerror(errno) << std::endl;
		buffer_size = 0;
		conf        = NULL;
		if (nested) return 1; // to prevent infinite recursion, we test the nested flag
		if (save_default) { // Create file with default OBV configuration
			return (SaveDefault(filepath));
		} else { // Create empty file
			ofstream file;
			file.open(filepath, std::ios::out | std::ios::binary | std::ios::ate);
			nested = true;
			file.close();
			return Load(filepath);
		}
	}

	this->filepath = filepath;

	if (conf) free(conf);

	std::streampos sz = file.tellg();
	buffer_size       = sz;
	conf              = (char *)calloc(1, buffer_size + 1);
	file.seekg(0, std::ios::beg);
	file.read(conf, sz);
	limit = conf + sz;
	file.close();

	if (file.gcount() != sz) {
		std::cerr << "Did not read the right number of bytes from configuration file " << file.gcount() << " != " << sz << std::endl;
		return 1;
	}
	//	assert(file.gcount() == sz);
	//
	//

	nested = false;

	return 0;
}